

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanQuotedScalar(Scanner *this)

{
  char cVar1;
  RegEx *ex;
  Stream *in_RDI;
  Mark MVar2;
  Token token;
  Mark mark;
  RegEx end;
  ScanScalarParams params;
  bool single;
  char quote;
  string scalar;
  undefined7 in_stack_fffffffffffffe58;
  char in_stack_fffffffffffffe5f;
  Stream *in_stack_fffffffffffffe60;
  Token *this_00;
  undefined7 in_stack_fffffffffffffe88;
  string local_158 [64];
  undefined1 local_118 [48];
  Mark local_e8;
  byte local_d9;
  Scanner *in_stack_ffffffffffffff40;
  bool local_b1;
  RegEx local_90;
  ScanScalarParams local_70;
  byte local_3d;
  char local_29;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  cVar1 = YAML::Stream::peek((Stream *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
                            );
  local_3d = cVar1 == '\'';
  local_29 = cVar1;
  ScanScalarParams::ScanScalarParams(&local_70);
  local_d9 = 0;
  local_b1 = (local_3d & 1) == 0;
  if (local_b1) {
    RegEx::RegEx((RegEx *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
  }
  else {
    RegEx::RegEx((RegEx *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f);
    ex = Exp::EscSingleQuote();
    operator!(ex);
    local_d9 = 1;
    operator&((RegEx *)CONCAT17(cVar1,in_stack_fffffffffffffe88),(RegEx *)in_RDI);
  }
  local_b1 = !local_b1;
  if ((local_d9 & 1) != 0) {
    RegEx::~RegEx((RegEx *)0xf219a9);
  }
  if (local_b1) {
    RegEx::~RegEx((RegEx *)0xf219c2);
  }
  local_70.end = &local_90;
  local_70.eatEnd = true;
  local_70.escape = '\\';
  if ((local_3d & 1) != 0) {
    local_70.escape = '\'';
  }
  local_70.indent = 0;
  local_70.fold = FOLD_FLOW;
  local_70.eatLeadingWhitespace = true;
  local_70.trimTrailingSpaces = false;
  local_70.chomp = CLIP;
  local_70.onDocIndicator = THROW;
  InsertPotentialSimpleKey(in_stack_ffffffffffffff40);
  MVar2 = YAML::Stream::mark(in_RDI);
  local_118._32_12_ = (undefined1  [12])MVar2;
  local_e8 = MVar2;
  YAML::Stream::get(in_stack_fffffffffffffe60);
  ScanScalar_abi_cxx11_
            ((Stream *)params.end,
             (ScanScalarParams *)
             end.m_params.super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  this_00 = (Token *)local_118;
  std::__cxx11::string::operator=(local_28,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 1;
  Token::Token(MVar2._0_8_,MVar2.column,(Mark *)this_00);
  std::__cxx11::string::operator=(local_158,local_28);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)this_00,
             (value_type *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  Token::~Token(this_00);
  RegEx::~RegEx((RegEx *)0xf21b42);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Scanner::ScanQuotedScalar() {
  std::string scalar;

  // peek at single or double quote (don't eat because we need to preserve (for
  // the time being) the input position)
  char quote = INPUT.peek();
  bool single = (quote == '\'');

  // setup the scanning parameters
  ScanScalarParams params;
  RegEx end = (single ? RegEx(quote) & !Exp::EscSingleQuote() : RegEx(quote));
  params.end = &end;
  params.eatEnd = true;
  params.escape = (single ? '\'' : '\\');
  params.indent = 0;
  params.fold = FOLD_FLOW;
  params.eatLeadingWhitespace = true;
  params.trimTrailingSpaces = false;
  params.chomp = CLIP;
  params.onDocIndicator = THROW;

  // insert a potential simple key
  InsertPotentialSimpleKey();

  Mark mark = INPUT.mark();

  // now eat that opening quote
  INPUT.get();

  // and scan
  scalar = ScanScalar(INPUT, params);
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  Token token(Token::NON_PLAIN_SCALAR, mark);
  token.value = scalar;
  m_tokens.push(token);
}